

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.cpp
# Opt level: O2

string * efsw::FileSystem::fileNameFromPath(string *__return_storage_ptr__,string *filepath)

{
  char cVar1;
  long lVar2;
  
  dirRemoveSlashAtEnd(filepath);
  cVar1 = Platform::FileSystem::getOSSlash();
  lVar2 = std::__cxx11::string::rfind((char)filepath,(ulong)(uint)(int)cVar1);
  if (lVar2 == -1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)filepath);
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)filepath);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FileSystem::fileNameFromPath( std::string filepath )
{
	dirRemoveSlashAtEnd( filepath );

	size_t pos = filepath.find_last_of( getOSSlash() );

	if ( pos != std::string::npos )
	{
		return filepath.substr( pos + 1 );
	}

	return filepath;
}